

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

DisconnectResult __thiscall
Chainstate::DisconnectBlock
          (Chainstate *this,CBlock *block,CBlockIndex *pindex,CCoinsViewCache *view)

{
  pointer pCVar1;
  long lVar2;
  uint256 *puVar3;
  CTransaction *this_00;
  uchar *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint3 uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  char *pcVar14;
  pointer pCVar15;
  uint uVar16;
  ulong uVar17;
  pointer pCVar18;
  uint uVar19;
  byte bVar20;
  byte bVar21;
  DisconnectResult DVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long in_FS_OFFSET;
  uchar uVar26;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  undefined1 auVar27 [16];
  uchar uVar43;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  undefined1 auVar44 [16];
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  uchar uVar65;
  uchar uVar66;
  uchar uVar67;
  uchar uVar68;
  uchar uVar69;
  uchar uVar70;
  uchar uVar71;
  uchar uVar72;
  uchar uVar73;
  uchar uVar74;
  uchar uVar75;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  ulong local_f8;
  CBlockUndo blockUndo;
  CTxOut local_b8;
  uint local_90;
  COutPoint out;
  Txid hash;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar10 = ::node::BlockManager::UndoReadFromDisk(this->m_blockman,&blockUndo,pindex);
  if (bVar10) {
    local_f8 = ((long)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 1;
    if (local_f8 ==
        (long)(block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4) {
      if (pindex->nHeight == 0x166a4) {
        puVar3 = pindex->phashBlock;
        if (puVar3 == (uint256 *)0x0) goto LAB_003f1889;
        uVar26 = (puVar3->super_base_blob<256U>).m_data._M_elems[0];
        uVar28 = (puVar3->super_base_blob<256U>).m_data._M_elems[1];
        uVar29 = (puVar3->super_base_blob<256U>).m_data._M_elems[2];
        uVar30 = (puVar3->super_base_blob<256U>).m_data._M_elems[3];
        uVar31 = (puVar3->super_base_blob<256U>).m_data._M_elems[4];
        uVar32 = (puVar3->super_base_blob<256U>).m_data._M_elems[5];
        uVar33 = (puVar3->super_base_blob<256U>).m_data._M_elems[6];
        uVar34 = (puVar3->super_base_blob<256U>).m_data._M_elems[7];
        local_b8.nValue = *(CAmount *)(puVar3->super_base_blob<256U>).m_data._M_elems;
        puVar4 = (puVar3->super_base_blob<256U>).m_data._M_elems + 8;
        uVar35 = *puVar4;
        uVar36 = (puVar3->super_base_blob<256U>).m_data._M_elems[9];
        uVar37 = (puVar3->super_base_blob<256U>).m_data._M_elems[10];
        uVar38 = (puVar3->super_base_blob<256U>).m_data._M_elems[0xb];
        uVar39 = (puVar3->super_base_blob<256U>).m_data._M_elems[0xc];
        uVar40 = (puVar3->super_base_blob<256U>).m_data._M_elems[0xd];
        uVar41 = (puVar3->super_base_blob<256U>).m_data._M_elems[0xe];
        uVar42 = (puVar3->super_base_blob<256U>).m_data._M_elems[0xf];
        local_b8.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
             (char *)*(undefined8 *)puVar4;
        puVar4 = (puVar3->super_base_blob<256U>).m_data._M_elems + 0x10;
        uVar43 = *puVar4;
        uVar45 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x11];
        uVar46 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x12];
        uVar47 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x13];
        uVar48 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x14];
        uVar49 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x15];
        uVar50 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x16];
        uVar51 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x17];
        local_b8.scriptPubKey.super_CScriptBase._union._8_8_ = *(undefined8 *)puVar4;
        puVar4 = (puVar3->super_base_blob<256U>).m_data._M_elems + 0x18;
        uVar52 = *puVar4;
        uVar53 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x19];
        uVar54 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1a];
        uVar55 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1b];
        uVar56 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1c];
        uVar57 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1d];
        uVar58 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1e];
        uVar59 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1f];
        local_b8.scriptPubKey.super_CScriptBase._union._16_8_ = *(undefined8 *)puVar4;
        uVar60 = '/';
        uVar61 = 'o';
        uVar62 = '0';
        uVar63 = 0xf9;
        uVar64 = 0xd6;
        uVar65 = 0x83;
        uVar66 = 0xde;
        uVar67 = 0xb8;
        uVar68 = ']';
        uVar69 = 0x93;
        uVar70 = '\x14';
        uVar71 = 0xef;
        uVar72 = ']';
        uVar73 = 0xcf;
        uVar74 = '6';
        uVar75 = 0xaf;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '/';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = 'o';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '0';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = 0xf9;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = 0xd6;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = 0x83;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = 0xde;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = 0xb8;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = ']';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = 0x93;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\x14';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = 0xef;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = ']';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = 0xcf;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '6';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = 0xaf;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = 'f';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd9;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = 0xe3;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = 0xce;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\x1a';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '+';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = 'y';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = 0xd4;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = 0xae;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = 0xf0;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\n';
        uVar9 = out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_3_;
LAB_003f153f:
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uVar9;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = (char)(uVar9 >> 8);
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)(uVar9 >> 0x10);
        uVar5 = out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
        auVar27[0] = -(uVar26 == uVar60);
        auVar27[1] = -(uVar28 == uVar61);
        auVar27[2] = -(uVar29 == uVar62);
        auVar27[3] = -(uVar30 == uVar63);
        auVar27[4] = -(uVar31 == uVar64);
        auVar27[5] = -(uVar32 == uVar65);
        auVar27[6] = -(uVar33 == uVar66);
        auVar27[7] = -(uVar34 == uVar67);
        auVar27[8] = -(uVar35 == uVar68);
        auVar27[9] = -(uVar36 == uVar69);
        auVar27[10] = -(uVar37 == uVar70);
        auVar27[0xb] = -(uVar38 == uVar71);
        auVar27[0xc] = -(uVar39 == uVar72);
        auVar27[0xd] = -(uVar40 == uVar73);
        auVar27[0xe] = -(uVar41 == uVar74);
        auVar27[0xf] = -(uVar42 == uVar75);
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar9;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)(uVar9 >> 8);
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)(uVar9 >> 0x10);
        auVar44[0] = -(uVar43 == out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar44[1] = -(uVar45 == out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar44[2] = -(uVar46 == out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar44[3] = -(uVar47 == out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar44[4] = -(uVar48 == out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar44[5] = -(uVar49 == out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar44[6] = -(uVar50 == out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar44[7] = -(uVar51 == out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar44[8] = -(uVar52 == out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar44[9] = -(uVar53 == out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar44[10] = -(uVar54 == out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar44[0xb] = -(uVar55 == '\0');
        auVar44[0xc] = -(uVar56 == '\0');
        auVar44[0xd] = -(uVar57 == '\0');
        auVar44[0xe] = -(uVar58 == '\0');
        auVar44[0xf] = -(uVar59 == '\0');
        auVar44 = auVar44 & auVar27;
        bVar10 = (ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar44[0xf] >> 7) << 0xf) == 0xffff;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar5;
      }
      else {
        if (pindex->nHeight == 0x1664a) {
          puVar3 = pindex->phashBlock;
          if (puVar3 == (uint256 *)0x0) goto LAB_003f1889;
          uVar26 = (puVar3->super_base_blob<256U>).m_data._M_elems[0];
          uVar28 = (puVar3->super_base_blob<256U>).m_data._M_elems[1];
          uVar29 = (puVar3->super_base_blob<256U>).m_data._M_elems[2];
          uVar30 = (puVar3->super_base_blob<256U>).m_data._M_elems[3];
          uVar31 = (puVar3->super_base_blob<256U>).m_data._M_elems[4];
          uVar32 = (puVar3->super_base_blob<256U>).m_data._M_elems[5];
          uVar33 = (puVar3->super_base_blob<256U>).m_data._M_elems[6];
          uVar34 = (puVar3->super_base_blob<256U>).m_data._M_elems[7];
          local_b8.nValue = *(CAmount *)(puVar3->super_base_blob<256U>).m_data._M_elems;
          puVar4 = (puVar3->super_base_blob<256U>).m_data._M_elems + 8;
          uVar35 = *puVar4;
          uVar36 = (puVar3->super_base_blob<256U>).m_data._M_elems[9];
          uVar37 = (puVar3->super_base_blob<256U>).m_data._M_elems[10];
          uVar38 = (puVar3->super_base_blob<256U>).m_data._M_elems[0xb];
          uVar39 = (puVar3->super_base_blob<256U>).m_data._M_elems[0xc];
          uVar40 = (puVar3->super_base_blob<256U>).m_data._M_elems[0xd];
          uVar41 = (puVar3->super_base_blob<256U>).m_data._M_elems[0xe];
          uVar42 = (puVar3->super_base_blob<256U>).m_data._M_elems[0xf];
          local_b8.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
               (char *)*(undefined8 *)puVar4;
          puVar4 = (puVar3->super_base_blob<256U>).m_data._M_elems + 0x10;
          uVar43 = *puVar4;
          uVar45 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x11];
          uVar46 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x12];
          uVar47 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x13];
          uVar48 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x14];
          uVar49 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x15];
          uVar50 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x16];
          uVar51 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x17];
          local_b8.scriptPubKey.super_CScriptBase._union._8_8_ = *(undefined8 *)puVar4;
          puVar4 = (puVar3->super_base_blob<256U>).m_data._M_elems + 0x18;
          uVar52 = *puVar4;
          uVar53 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x19];
          uVar54 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1a];
          uVar55 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1b];
          uVar56 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1c];
          uVar57 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1d];
          uVar58 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1e];
          uVar59 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1f];
          local_b8.scriptPubKey.super_CScriptBase._union._16_8_ = *(undefined8 *)puVar4;
          uVar60 = 0x8e;
          uVar61 = 0xd0;
          uVar62 = 'M';
          uVar63 = 'W';
          uVar64 = 0xf2;
          uVar65 = 0xf3;
          uVar66 = 0xcd;
          uVar67 = 0xc6;
          uVar68 = 0xa6;
          uVar69 = 0xe5;
          uVar70 = 'U';
          uVar71 = 'i';
          uVar72 = 0xdc;
          uVar73 = '\x16';
          uVar74 = 'T';
          uVar75 = 0xe1;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = 0x8e;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = 0xd0;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = 'M';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = 'W';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = 0xf2;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = 0xf3;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = 0xcd;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = 0xc6;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = 0xa6;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = 0xe5;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = 'U';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = 'i';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = 0xdc;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\x16';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = 'T';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = 0xe1;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = 0xf2;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\x19';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = 0x84;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\x7f';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = 'f';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = 0xe7;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '&';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = 0xdc;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = 0xa2;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = 'q';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\x02';
          uVar9 = out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_3_;
          goto LAB_003f153f;
        }
        bVar10 = false;
      }
      uVar16 = (int)local_f8 - 1;
      if ((int)uVar16 < 0) {
        DVar22 = DISCONNECT_OK;
      }
      else {
        local_f8 = local_f8 & 0xffffffff;
        bVar20 = 1;
        bVar21 = 1;
        uVar17 = (ulong)uVar16;
        do {
          this_00 = (block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar17].
                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar5 = *(undefined8 *)(this_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          uVar6 = *(undefined8 *)
                   ((this_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          uVar7 = *(undefined8 *)
                   ((this_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          uVar8 = *(undefined8 *)
                   ((this_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          bVar11 = CTransaction::IsCoinBase(this_00);
          pCVar15 = (this_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar18 = (this_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (pCVar18 != pCVar15) {
            lVar25 = 0;
            uVar23 = 0;
            do {
              uVar16 = *(uint *)((long)&(pCVar15->scriptPubKey).super_CScriptBase._size + lVar25);
              uVar19 = uVar16 - 0x1d;
              if (uVar16 < 0x1d) {
                uVar19 = uVar16;
              }
              if (uVar19 == 0) {
LAB_003f162f:
                out.n = (uint32_t)uVar23;
                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar5;
                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = uVar6;
                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar7;
                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar8;
                CTxOut::CTxOut(&local_b8);
                local_90 = 0;
                bVar12 = CCoinsViewCache::SpendCoin(view,&out,(Coin *)&local_b8);
                if ((((!bVar12) ||
                     (((pCVar15 = (this_00->vout).
                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                       *(long *)((long)&pCVar15->nValue + lVar25) != local_b8.nValue ||
                       (bVar12 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                                           ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                            ((long)&(pCVar15->scriptPubKey).super_CScriptBase._union
                                            + lVar25),&local_b8.scriptPubKey.super_CScriptBase),
                       !bVar12)) || (pindex->nHeight != local_90 >> 1)))) ||
                    ((((byte)local_90 ^ bVar11) & 1) != 0)) &&
                   (bVar21 = bVar20, (bVar10 & bVar11) == 0)) {
                  bVar20 = 0;
                  bVar21 = 0;
                }
                if (0x1c < local_b8.scriptPubKey.super_CScriptBase._size) {
                  free(local_b8.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
                }
                pCVar15 = (this_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pCVar18 = (this_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                pcVar14 = (pCVar15->scriptPubKey).super_CScriptBase._union.direct + lVar25;
                if (0x1c < uVar16) {
                  pcVar14 = *(char **)pcVar14;
                }
                if ((uVar19 < 0x2711) && (*pcVar14 != 'j')) goto LAB_003f162f;
              }
              uVar23 = uVar23 + 1;
              lVar25 = lVar25 + 0x28;
            } while (uVar23 < (ulong)(((long)pCVar18 - (long)pCVar15 >> 3) * -0x3333333333333333));
          }
          if (uVar17 == 0) break;
          uVar16 = (int)local_f8 - 2;
          uVar23 = ((long)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar16].vprevout.
                          super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar16].vprevout.
                          super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                          super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
          if (uVar23 + ((long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * -0x4ec4ec4ec4ec4ec5
              != 0) {
            logging_function_00._M_str = "DisconnectBlock";
            logging_function_00._M_len = 0xf;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_00._M_len = 0x5e;
            LogPrintFormatInternal<>
                      (logging_function_00,source_file_00,0x908,ALL,Error,
                       (ConstevalFormatString<0U>)0x80d6dc);
LAB_003f187b:
            DVar22 = DISCONNECT_FAILED;
            goto LAB_003f14b4;
          }
          pCVar1 = blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar16;
          uVar23 = uVar23 & 0xffffffff;
          lVar25 = uVar23 * 0x30 + -0x30;
          lVar24 = uVar23 * 0x68;
          while( true ) {
            if (lVar25 + -0x30 == -0x60) break;
            iVar13 = ApplyTxInUndo((Coin *)((long)&(((pCVar1->vprevout).
                                                     super__Vector_base<Coin,_std::allocator<Coin>_>
                                                     ._M_impl.super__Vector_impl_data._M_start)->out
                                                   ).nValue + lVar25),view,
                                   (COutPoint *)
                                   ((long)&(this_00->vin).
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start[-1].prevout.hash +
                                   lVar24));
            bVar21 = bVar21 & iVar13 != 1;
            lVar25 = lVar25 + -0x30;
            bVar20 = bVar21;
            lVar24 = lVar24 + -0x68;
            if (iVar13 == 2) goto LAB_003f187b;
          }
          local_f8 = local_f8 - 1;
          bVar11 = 0 < (long)uVar17;
          uVar17 = uVar17 - 1;
        } while (bVar11);
        DVar22 = (DisconnectResult)(~bVar21 & 1);
      }
      puVar3 = pindex->pprev->phashBlock;
      if (puVar3 == (uint256 *)0x0) {
LAB_003f1889:
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_b8.nValue = *(CAmount *)(puVar3->super_base_blob<256U>).m_data._M_elems;
      local_b8.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)*(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
      local_b8.scriptPubKey.super_CScriptBase._union._8_8_ =
           *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_b8.scriptPubKey.super_CScriptBase._union._16_8_ =
           *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
      CCoinsViewCache::SetBestBlock(view,(uint256 *)&local_b8);
      goto LAB_003f14b4;
    }
    pcVar14 = "DisconnectBlock(): block and undo data inconsistent\n";
    iVar13 = 0x8e1;
  }
  else {
    pcVar14 = "DisconnectBlock(): failure reading undo data\n";
    iVar13 = 0x8dc;
  }
  DVar22 = DISCONNECT_FAILED;
  logging_function._M_str = "DisconnectBlock";
  logging_function._M_len = 0xf;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file._M_len = 0x5e;
  LogPrintFormatInternal<>
            (logging_function,source_file,iVar13,ALL,Error,(ConstevalFormatString<0U>)pcVar14);
LAB_003f14b4:
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&blockUndo.vtxundo);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return DVar22;
}

Assistant:

DisconnectResult Chainstate::DisconnectBlock(const CBlock& block, const CBlockIndex* pindex, CCoinsViewCache& view)
{
    AssertLockHeld(::cs_main);
    bool fClean = true;

    CBlockUndo blockUndo;
    if (!m_blockman.UndoReadFromDisk(blockUndo, *pindex)) {
        LogError("DisconnectBlock(): failure reading undo data\n");
        return DISCONNECT_FAILED;
    }

    if (blockUndo.vtxundo.size() + 1 != block.vtx.size()) {
        LogError("DisconnectBlock(): block and undo data inconsistent\n");
        return DISCONNECT_FAILED;
    }

    // Ignore blocks that contain transactions which are 'overwritten' by later transactions,
    // unless those are already completely spent.
    // See https://github.com/bitcoin/bitcoin/issues/22596 for additional information.
    // Note: the blocks specified here are different than the ones used in ConnectBlock because DisconnectBlock
    // unwinds the blocks in reverse. As a result, the inconsistency is not discovered until the earlier
    // blocks with the duplicate coinbase transactions are disconnected.
    bool fEnforceBIP30 = !((pindex->nHeight==91722 && pindex->GetBlockHash() == uint256{"00000000000271a2dc26e7667f8419f2e15416dc6955e5a6c6cdf3f2574dd08e"}) ||
                           (pindex->nHeight==91812 && pindex->GetBlockHash() == uint256{"00000000000af0aed4792b1acee3d966af36cf5def14935db8de83d6f9306f2f"}));

    // undo transactions in reverse order
    for (int i = block.vtx.size() - 1; i >= 0; i--) {
        const CTransaction &tx = *(block.vtx[i]);
        Txid hash = tx.GetHash();
        bool is_coinbase = tx.IsCoinBase();
        bool is_bip30_exception = (is_coinbase && !fEnforceBIP30);

        // Check that all outputs are available and match the outputs in the block itself
        // exactly.
        for (size_t o = 0; o < tx.vout.size(); o++) {
            if (!tx.vout[o].scriptPubKey.IsUnspendable()) {
                COutPoint out(hash, o);
                Coin coin;
                bool is_spent = view.SpendCoin(out, &coin);
                if (!is_spent || tx.vout[o] != coin.out || pindex->nHeight != coin.nHeight || is_coinbase != coin.fCoinBase) {
                    if (!is_bip30_exception) {
                        fClean = false; // transaction output mismatch
                    }
                }
            }
        }

        // restore inputs
        if (i > 0) { // not coinbases
            CTxUndo &txundo = blockUndo.vtxundo[i-1];
            if (txundo.vprevout.size() != tx.vin.size()) {
                LogError("DisconnectBlock(): transaction and undo data inconsistent\n");
                return DISCONNECT_FAILED;
            }
            for (unsigned int j = tx.vin.size(); j > 0;) {
                --j;
                const COutPoint& out = tx.vin[j].prevout;
                int res = ApplyTxInUndo(std::move(txundo.vprevout[j]), view, out);
                if (res == DISCONNECT_FAILED) return DISCONNECT_FAILED;
                fClean = fClean && res != DISCONNECT_UNCLEAN;
            }
            // At this point, all of txundo.vprevout should have been moved out.
        }
    }

    // move best block pointer to prevout block
    view.SetBestBlock(pindex->pprev->GetBlockHash());

    return fClean ? DISCONNECT_OK : DISCONNECT_UNCLEAN;
}